

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_locate(REF_INTERP ref_interp)

{
  REF_INT *cell;
  size_t __size;
  int iVar1;
  REF_MPI ref_mpi;
  REF_MPI pRVar2;
  REF_GRID pRVar3;
  REF_GRID pRVar4;
  REF_NODE pRVar5;
  REF_DBL *pRVar6;
  REF_DBL *pRVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  ulong uVar12;
  REF_DBL *pRVar13;
  undefined8 uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  REF_NODE pRVar19;
  char *pcVar20;
  REF_INT n;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  double dVar24;
  uint local_108;
  REF_INT total_node;
  REF_MPI local_e8;
  undefined8 local_e0;
  REF_BOOL increase_fuzz;
  undefined4 uStack_d4;
  REF_NODE local_d0;
  REF_INT *local_c8;
  REF_GRID local_c0;
  void *local_b8;
  REF_INT nrecv;
  REF_INT *local_a8;
  REF_INT *source;
  REF_LIST from_geom_list;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  REF_DBL *global_xyz;
  REF_DBL *local_68;
  REF_GRID local_60;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  void *local_38;
  
  ref_mpi = ref_interp->ref_mpi;
  if ((ref_interp->instrument != 0) && (uVar9 = ref_mpi_stopwatch_start(ref_mpi), uVar9 != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x6ba,
           "ref_interp_locate",(ulong)uVar9,"locate clock");
    return uVar9;
  }
  pRVar2 = ref_interp->ref_mpi;
  pRVar3 = ref_interp->from_grid;
  pRVar4 = ref_interp->to_grid;
  pRVar5 = pRVar4->node;
  pRVar19 = pRVar3->node;
  local_108 = ref_list_create((REF_LIST *)&increase_fuzz);
  if (local_108 == 0) {
    local_e8 = pRVar2;
    local_e0 = pRVar19;
    local_d0 = pRVar5;
    local_c0 = pRVar4;
    local_60 = pRVar3;
    uVar9 = ref_list_create(&from_geom_list);
    pRVar5 = local_d0;
    if (uVar9 == 0) {
      uVar9 = ref_interp_geom_node_list(local_c0,(REF_LIST)CONCAT44(uStack_d4,increase_fuzz));
      if (uVar9 == 0) {
        uVar9 = ref_interp_geom_node_list(local_60,from_geom_list);
        if (uVar9 == 0) {
          puVar8 = (uint *)CONCAT44(uStack_d4,increase_fuzz);
          uVar9 = *puVar8;
          if ((int)uVar9 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3f2,"ref_interp_geom_nodes","malloc local_node of REF_INT negative");
            uVar9 = 1;
          }
          else {
            pvVar11 = malloc((ulong)uVar9 * 4);
            if (pvVar11 == (void *)0x0) {
              pcVar20 = "malloc local_node of REF_INT NULL";
              uVar14 = 0x3f2;
            }
            else {
              local_80 = pvVar11;
              pvVar11 = malloc((ulong)uVar9 * 0x18);
              pRVar2 = local_e8;
              if (pvVar11 == (void *)0x0) {
                pcVar20 = "malloc local_xyz of REF_DBL NULL";
                uVar14 = 0x3f3;
              }
              else {
                if (uVar9 != 0) {
                  lVar21 = *(long *)(puVar8 + 2);
                  pRVar6 = pRVar5->real;
                  pRVar13 = (REF_DBL *)((long)pvVar11 + 0x10);
                  lVar17 = 0;
                  do {
                    iVar16 = *(int *)(lVar21 + lVar17 * 4);
                    lVar18 = (long)iVar16;
                    *(int *)((long)local_80 + lVar17 * 4) = iVar16;
                    pRVar13[-2] = pRVar6[lVar18 * 0xf];
                    pRVar13[-1] = pRVar6[lVar18 * 0xf + 1];
                    *pRVar13 = pRVar6[lVar18 * 0xf + 2];
                    lVar17 = lVar17 + 1;
                    uVar9 = *puVar8;
                    pRVar13 = pRVar13 + 3;
                  } while (lVar17 < (int)uVar9);
                }
                local_38 = pvVar11;
                uVar9 = ref_mpi_allconcat(local_e8,3,uVar9,pvVar11,&total_node,&source,&global_xyz,3
                                         );
                if (uVar9 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x3fe,"ref_interp_geom_nodes",(ulong)uVar9,"cat");
                  goto LAB_00138a89;
                }
                if (source != (REF_INT *)0x0) {
                  free(source);
                }
                uVar9 = ref_mpi_allconcat(pRVar2,1,*(REF_INT *)CONCAT44(uStack_d4,increase_fuzz),
                                          local_80,&total_node,&source,&global_node,1);
                n = total_node;
                if (uVar9 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x403,"ref_interp_geom_nodes",(ulong)uVar9,"cat");
                  goto LAB_00138a89;
                }
                lVar21 = (long)total_node;
                if (lVar21 < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x405,"ref_interp_geom_nodes","malloc best_dist of REF_DBL negative");
                  uVar9 = 1;
                  goto LAB_00138a89;
                }
                local_68 = (REF_DBL *)malloc(lVar21 * 8);
                if (local_68 == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x405,"ref_interp_geom_nodes","malloc best_dist of REF_DBL NULL");
                  uVar9 = 2;
                  goto LAB_00138a89;
                }
                local_c0 = (REF_GRID)malloc(lVar21 * 4);
                if (local_c0 == (REF_GRID)0x0) {
                  pcVar20 = "malloc best_node of REF_INT NULL";
                  uVar14 = 0x406;
                }
                else {
                  local_a8 = (REF_INT *)malloc(lVar21 * 4);
                  pRVar6 = local_68;
                  pRVar5 = local_e0;
                  if (local_a8 != (REF_INT *)0x0) {
                    if (n != 0) {
                      lVar21 = 0;
                      do {
                        pRVar13 = global_xyz;
                        pRVar6[lVar21] = 1e+20;
                        *(undefined4 *)((long)local_c0->cell + lVar21 * 4 + -0x10) = 0xffffffff;
                        if (0 < from_geom_list->n) {
                          lVar17 = 0;
                          do {
                            pRVar19 = (REF_NODE)(long)from_geom_list->value[lVar17];
                            pRVar7 = pRVar5->real;
                            dVar24 = (pRVar13[lVar21 * 3 + 2] - pRVar7[(long)pRVar19 * 0xf + 2]) *
                                     (pRVar13[lVar21 * 3 + 2] - pRVar7[(long)pRVar19 * 0xf + 2]) +
                                     (pRVar13[lVar21 * 3 + 1] - pRVar7[(long)pRVar19 * 0xf + 1]) *
                                     (pRVar13[lVar21 * 3 + 1] - pRVar7[(long)pRVar19 * 0xf + 1]) +
                                     (pRVar13[lVar21 * 3] - pRVar7[(long)pRVar19 * 0xf]) *
                                     (pRVar13[lVar21 * 3] - pRVar7[(long)pRVar19 * 0xf]);
                            if (dVar24 < 0.0) {
                              local_d0 = pRVar19;
                              dVar24 = sqrt(dVar24);
                              pRVar19 = local_d0;
                            }
                            else {
                              dVar24 = SQRT(dVar24);
                            }
                            if ((lVar17 == 0) || (dVar24 < pRVar6[lVar21])) {
                              pRVar6[lVar21] = dVar24;
                              *(int *)((long)local_c0->cell + lVar21 * 4 + -0x10) = (int)pRVar19;
                            }
                            lVar17 = lVar17 + 1;
                          } while (lVar17 < from_geom_list->n);
                        }
                        lVar21 = lVar21 + 1;
                        n = total_node;
                      } while (lVar21 < total_node);
                    }
                    uVar9 = ref_mpi_allminwho(local_e8,pRVar6,local_a8,n);
                    if (uVar9 == 0) {
                      if ((long)total_node < 1) {
                        uVar22 = 0;
                      }
                      else {
                        lVar21 = 0;
                        uVar22 = 0;
                        do {
                          uVar22 = (ulong)((int)uVar22 + (uint)(local_e8->id == local_a8[lVar21]));
                          lVar21 = lVar21 + 1;
                        } while (total_node != lVar21);
                      }
                      iVar16 = (int)uVar22;
                      if (iVar16 < 0) {
                        pcVar20 = "malloc send_bary of REF_DBL negative";
                        uVar14 = 0x41f;
LAB_001392c3:
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,uVar14,"ref_interp_geom_nodes",pcVar20);
                        uVar9 = 1;
                      }
                      else {
                        local_d0 = (REF_NODE)malloc((ulong)(uint)(iVar16 * 4) << 3);
                        if (local_d0 == (REF_NODE)0x0) {
                          pcVar20 = "malloc send_bary of REF_DBL NULL";
                          uVar14 = 0x41f;
                        }
                        else {
                          __size = uVar22 * 4;
                          local_88 = malloc(__size);
                          if (local_88 == (void *)0x0) {
                            pcVar20 = "malloc send_cell of REF_INT NULL";
                            uVar14 = 0x420;
                          }
                          else {
                            local_90 = malloc(__size);
                            if (local_90 == (void *)0x0) {
                              pcVar20 = "malloc send_node of REF_INT NULL";
                              uVar14 = 0x421;
                            }
                            else {
                              local_c8 = (REF_INT *)malloc(__size);
                              if (local_c8 != (REF_INT *)0x0) {
                                pvVar11 = malloc(__size);
                                if (pvVar11 == (void *)0x0) {
                                  local_b8 = (void *)0x0;
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x423,"ref_interp_geom_nodes",
                                         "malloc my_proc of REF_INT NULL");
                                  local_108 = 2;
                                }
                                else {
                                  local_b8 = pvVar11;
                                  if (iVar16 != 0) {
                                    uVar12 = 0;
                                    do {
                                      *(REF_INT *)((long)pvVar11 + uVar12 * 4) = local_e8->id;
                                      uVar12 = uVar12 + 1;
                                    } while (uVar22 != uVar12);
                                  }
                                }
                                uVar9 = local_108;
                                if (pvVar11 != (void *)0x0) {
                                  if (total_node < 1) {
                                    local_e0 = (REF_NODE)((ulong)local_e0._4_4_ << 0x20);
                                  }
                                  else {
                                    lVar21 = 0;
                                    lVar17 = 0;
                                    local_e0 = (REF_NODE)((ulong)local_e0._4_4_ << 0x20);
                                    do {
                                      if (local_e8->id == local_a8[lVar17]) {
                                        iVar16 = *(int *)((long)local_c0->cell + lVar17 * 4 + -0x10)
                                        ;
                                        if (iVar16 == -1) {
                                          pcVar20 = "no geom node";
                                          uVar14 = 0x428;
                                          goto LAB_001392c3;
                                        }
                                        lVar18 = (long)(int)local_e0;
                                        *(REF_INT *)((long)local_90 + lVar18 * 4) =
                                             global_node[lVar17];
                                        local_c8[lVar18] = source[lVar17];
                                        cell = (REF_INT *)((long)local_88 + lVar18 * 4);
                                        if (local_60->twod == 0) {
                                          uVar10 = ref_interp_exhaustive_tet_around_node
                                                             (ref_interp,iVar16,
                                                              (REF_DBL *)((long)global_xyz + lVar21)
                                                              ,cell,(REF_DBL *)
                                                                    (&local_d0->n +
                                                                    (long)((int)local_e0 * 4) * 2));
                                          if (uVar10 != 0) {
                                            uVar14 = 0x435;
                                            pcVar20 = "tet around node";
                                            goto LAB_001394d1;
                                          }
                                        }
                                        else {
                                          uVar10 = ref_interp_exhaustive_tri_around_node
                                                             (ref_interp,iVar16,
                                                              (REF_DBL *)((long)global_xyz + lVar21)
                                                              ,cell,(REF_DBL *)
                                                                    (&local_d0->n +
                                                                    (long)((int)local_e0 * 4) * 2));
                                          if (uVar10 != 0) {
                                            uVar14 = 0x430;
                                            pcVar20 = "tri around node";
LAB_001394d1:
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,uVar14,"ref_interp_geom_nodes",(ulong)uVar10,
                                                  pcVar20);
                                            local_108 = uVar10;
                                          }
                                        }
                                        uVar9 = local_108;
                                        if (uVar10 != 0) goto LAB_00138a89;
                                        local_e0 = (REF_NODE)
                                                   CONCAT44(local_e0._4_4_,(int)local_e0 + 1);
                                      }
                                      lVar17 = lVar17 + 1;
                                      lVar21 = lVar21 + 0x18;
                                    } while (lVar17 < total_node);
                                  }
                                  uVar9 = ref_mpi_blindsend(local_e8,local_c8,local_90,1,
                                                            (int)local_e0,&recv_node,&nrecv,1);
                                  if (uVar9 == 0) {
                                    uVar9 = ref_mpi_blindsend(local_e8,local_c8,local_88,1,
                                                              (int)local_e0,&recv_cell,&nrecv,1);
                                    if (uVar9 == 0) {
                                      uVar9 = ref_mpi_blindsend(local_e8,local_c8,local_b8,1,
                                                                (int)local_e0,&recv_proc,&nrecv,1);
                                      if (uVar9 == 0) {
                                        uVar9 = ref_mpi_blindsend(local_e8,local_c8,local_d0,4,
                                                                  (int)local_e0,&local_78,&nrecv,3);
                                        if (uVar9 == 0) {
                                          if (0 < nrecv) {
                                            lVar17 = 0;
                                            lVar21 = 0;
                                            do {
                                              dVar24 = ref_interp->inside;
                                              if ((((*(double *)((long)local_78 + lVar21 * 0x20) <=
                                                     dVar24) ||
                                                   (*(double *)((long)local_78 + lVar21 * 0x20 + 8)
                                                    <= dVar24)) ||
                                                  (*(double *)
                                                    ((long)local_78 + lVar21 * 0x20 + 0x10) <=
                                                   dVar24)) ||
                                                 (*(double *)((long)local_78 + lVar21 * 0x20 + 0x18)
                                                  <= dVar24)) {
                                                ref_interp->n_geom_fail =
                                                     ref_interp->n_geom_fail + 1;
                                              }
                                              else {
                                                ref_interp->n_geom = ref_interp->n_geom + 1;
                                                iVar16 = recv_node[lVar21];
                                                lVar18 = (long)iVar16;
                                                iVar1 = ref_interp->cell[lVar18];
                                                if ((long)iVar1 != -1) {
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x44e,"ref_interp_geom_nodes",
                                                  "geom already found?",0xffffffffffffffff,
                                                  (long)iVar1);
                                                  local_108 = 1;
                                                }
                                                uVar9 = local_108;
                                                if (iVar1 != -1) goto LAB_00138a89;
                                                if (ref_interp->agent_hired[lVar18] != 0) {
                                                  uVar9 = ref_agents_delete(ref_interp->ref_agents,
                                                                            iVar16);
                                                  if (uVar9 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x450,"ref_interp_geom_nodes",(ulong)uVar9,"deq")
                                                  ;
                                                  goto LAB_00138a89;
                                                  }
                                                  ref_interp->agent_hired[lVar18] = 0;
                                                }
                                                ref_interp->cell[lVar18] = recv_cell[lVar21];
                                                ref_interp->part[lVar18] = recv_proc[lVar21];
                                                pRVar6 = ref_interp->bary;
                                                lVar15 = 0;
                                                do {
                                                  pRVar6[lVar18 * 4 + lVar15] =
                                                       *(REF_DBL *)
                                                        ((long)local_78 + lVar15 * 8 + lVar17);
                                                  lVar15 = lVar15 + 1;
                                                } while (lVar15 != 4);
                                                uVar9 = ref_interp_push_onto_queue
                                                                  (ref_interp,iVar16);
                                                if (uVar9 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x457,"ref_interp_geom_nodes",(ulong)uVar9,"push"
                                                  );
                                                  goto LAB_00138a89;
                                                }
                                              }
                                              lVar21 = lVar21 + 1;
                                              lVar17 = lVar17 + 0x20;
                                            } while (lVar21 < nrecv);
                                          }
                                          uVar9 = ref_mpi_allsum(local_e8,&ref_interp->n_geom,1,1);
                                          if (uVar9 == 0) {
                                            uVar9 = ref_mpi_allsum(local_e8,&ref_interp->n_geom_fail
                                                                   ,1,1);
                                            if (uVar9 == 0) {
                                              if (recv_node != (REF_INT *)0x0) {
                                                free(recv_node);
                                              }
                                              if (recv_cell != (REF_INT *)0x0) {
                                                free(recv_cell);
                                              }
                                              if (recv_proc != (REF_INT *)0x0) {
                                                free(recv_proc);
                                              }
                                              if (local_78 != (void *)0x0) {
                                                free(local_78);
                                              }
                                              free(local_d0);
                                              if (local_b8 != (void *)0x0) {
                                                free(local_b8);
                                              }
                                              free(local_88);
                                              free(local_90);
                                              free(local_c8);
                                              free(local_a8);
                                              free(local_c0);
                                              free(local_68);
                                              if (source != (REF_INT *)0x0) {
                                                free(source);
                                              }
                                              if (global_node != (REF_INT *)0x0) {
                                                free(global_node);
                                              }
                                              if (global_xyz != (REF_DBL *)0x0) {
                                                free(global_xyz);
                                              }
                                              free(local_38);
                                              free(local_80);
                                              ref_list_free(from_geom_list);
                                              ref_list_free((REF_LIST)
                                                            CONCAT44(uStack_d4,increase_fuzz));
                                              uVar9 = 0;
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x45f,"ref_interp_geom_nodes",(ulong)uVar9,"as");
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x45d,"ref_interp_geom_nodes",(ulong)uVar9,"as");
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                 ,0x445,"ref_interp_geom_nodes",(ulong)uVar9,
                                                 "blind send bary");
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                               ,0x442,"ref_interp_geom_nodes",(ulong)uVar9,
                                               "blind send proc");
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                             ,0x43f,"ref_interp_geom_nodes",(ulong)uVar9,
                                             "blind send cell");
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x43c,"ref_interp_geom_nodes",(ulong)uVar9,
                                           "blind send node");
                                  }
                                }
                                goto LAB_00138a89;
                              }
                              pcVar20 = "malloc send_proc of REF_INT NULL";
                              uVar14 = 0x422;
                            }
                          }
                        }
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,uVar14,"ref_interp_geom_nodes",pcVar20);
                        uVar9 = 2;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x419,"ref_interp_geom_nodes",(ulong)uVar9,"who");
                    }
                    goto LAB_00138a89;
                  }
                  pcVar20 = "malloc from_proc of REF_INT NULL";
                  uVar14 = 0x407;
                }
              }
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar14,"ref_interp_geom_nodes",pcVar20);
            uVar9 = 2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x3f0,"ref_interp_geom_nodes",(ulong)uVar9,"from list");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x3ef,"ref_interp_geom_nodes",(ulong)uVar9,"to list");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x3ee,"ref_interp_geom_nodes",(ulong)uVar9,"create list");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x3ed,
           "ref_interp_geom_nodes",(ulong)local_108,"create list");
    uVar9 = local_108;
  }
LAB_00138a89:
  if (uVar9 == 0) {
    if ((ref_interp->instrument == 0) ||
       (uVar9 = ref_mpi_stopwatch_stop(ref_mpi,"geom"), uVar9 == 0)) {
      uVar9 = ref_interp_process_agents(ref_interp);
      if (uVar9 == 0) {
        if ((ref_interp->instrument == 0) ||
           (uVar9 = ref_mpi_stopwatch_stop(ref_mpi,"drain"), uVar9 == 0)) {
          increase_fuzz = 0;
          iVar16 = 0xb;
          do {
            if ((increase_fuzz != 0) &&
               (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, ref_mpi->id == 0)) {
              printf("retry tree search with %e fuzz\n");
            }
            uVar9 = ref_interp_tree(ref_interp,&increase_fuzz);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x6cc,"ref_interp_locate",(ulong)uVar9,"tree");
              return uVar9;
            }
            if ((ref_interp->instrument != 0) &&
               (uVar9 = ref_mpi_stopwatch_stop(ref_mpi,"tree"), uVar9 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x6ce,"ref_interp_locate",(ulong)uVar9,"locate clock");
              return uVar9;
            }
            bVar23 = iVar16 != 0;
            iVar16 = iVar16 + -1;
          } while ((increase_fuzz != 0) && (bVar23));
          if ((long)increase_fuzz == 0) {
            uVar9 = 0;
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x6d1,"ref_interp_locate","unable to grow fuzz to find tree candidate",0,
                   (long)increase_fuzz);
            uVar9 = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x6c2,"ref_interp_locate",(ulong)uVar9,"locate clock");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x6c0,"ref_interp_locate",(ulong)uVar9,"drain");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x6be,"ref_interp_locate",(ulong)uVar9,"locate clock");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x6bc,
           "ref_interp_locate",(ulong)uVar9,"geom nodes");
  }
  return uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_BOOL increase_fuzz;
  REF_INT tries;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  RSS(ref_interp_geom_nodes(ref_interp), "geom nodes");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "geom"), "locate clock");

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}